

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O1

double msr_get_pl4_limit(raplcap_msr_ctx *ctx,raplcap_zone zone,uint64_t msrval)

{
  undefined4 uVar1;
  double dVar2;
  
  if (ctx != (raplcap_msr_ctx *)0x0) {
    uVar1 = 0x1fff;
    if (ctx->cpu_model == 0xbd) {
      uVar1 = 0xffff;
    }
    if (ctx->cpu_model == 0xaa) {
      uVar1 = 0xffff;
    }
    dVar2 = (*ctx->cfg[zone].from_msr_pl)((ulong)msrval & (ulong)uVar1,ctx->power_units);
    return dVar2;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x2e1,"double msr_get_pl4_limit(const raplcap_msr_ctx *, raplcap_zone, uint64_t)");
}

Assistant:

double msr_get_pl4_limit(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint64_t msrval) {
  assert(ctx != NULL);
  uint64_t pl_mask = PL4_MASK;
  pl4_limit_quirks(ctx, NULL, &pl_mask);
  double watts = ctx->cfg[zone].from_msr_pl((msrval >> PL4_SHIFT) & pl_mask, ctx->power_units);
  raplcap_log(DEBUG, "msr_get_pl4_limit: zone=%d, power=%.12f W\n", zone, watts);
  return watts;
}